

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ImportInfo *pIVar3;
  char *__s;
  ManagedType MVar4;
  allocator<char> local_39;
  string local_38;
  
  TVar2 = GetType(this);
  MVar4 = Undefined;
  if ((int)TVar2 < 3) {
    TVar2 = GetType(this);
    if (TVar2 == STATIC_LIBRARY) {
      MVar4 = Native;
    }
    else {
      bVar1 = IsImported(this);
      if (bVar1) {
        pIVar3 = GetImportInfo(this,config);
        MVar4 = Undefined;
        if (pIVar3 != (ImportInfo *)0x0) {
          MVar4 = pIVar3->Managed;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"COMMON_LANGUAGE_RUNTIME",&local_39);
        __s = GetProperty(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        if (__s == (char *)0x0) {
          bVar1 = IsCSharpOnly(this);
          MVar4 = (uint)bVar1 * 2 + Native;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
          MVar4 = Managed - (local_38._M_string_length == 0);
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
    }
  }
  return MVar4;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (auto* clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}